

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::
FormatForComparisonFailureMessage<std::tuple<int,int,int,int,int,int,int,int,int,int>,std::tuple<int,int,int,int,int,int,int,int,int,int>>
          (string *__return_storage_ptr__,internal *this,
          tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *value,
          tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *param_2)

{
  tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *param_1_local;
  tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *value_local;
  
  PrintToString<std::tuple<int,int,int,int,int,int,int,int,int,int>>
            (__return_storage_ptr__,(iutest *)this,value);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}